

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.H
# Opt level: O3

int Fl_Text_Editor::kf_copy(int param_1,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  Fl *this_00;
  size_t sVar1;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  if ((this->mPrimary).mSelected != false) {
    this_00 = (Fl *)Fl_Text_Buffer::selection_text(this);
    if (*this_00 != (Fl)0x0) {
      sVar1 = strlen((char *)this_00);
      Fl::copy(this_00,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff),(EVP_PKEY_CTX *)&DAT_00000001);
    }
    free(this_00);
    Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  }
  return 1;
}

Assistant:

Fl_Text_Buffer* buffer() const { return mBuffer; }